

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
convolute(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Settings *s,
         Data *d,vector<unsigned_int,_std::allocator<unsigned_int>_> *kernel)

{
  double lat_00;
  int iVar1;
  bool bVar2;
  value_type vVar3;
  uint uVar4;
  undefined4 uVar5;
  Data *s_00;
  int iVar6;
  iterator __first;
  iterator __last;
  ostream *poVar7;
  reference pvVar8;
  reference pvVar9;
  double *pdVar10;
  __type _Var11;
  __type _Var12;
  double local_1d0;
  double local_1c8;
  double pixstart;
  double pixres;
  double ddres;
  double y1_1;
  double x1_1;
  double y0_1;
  double x0_1;
  double dpix0;
  double sca;
  double lon;
  double lat;
  double s1;
  double s0;
  double y1;
  double x1;
  double y0;
  double x0;
  double local_120;
  double dpix;
  double dStack_110;
  int i_1;
  double dd0;
  double dd;
  undefined1 local_f8 [4];
  uint iseg;
  string local_d8;
  int local_b4;
  undefined1 local_b0 [4];
  int i;
  double local_90;
  double scaleMax;
  double scalar;
  string local_78 [8];
  string pstr;
  int np;
  allocator<unsigned_int> local_2a;
  byte local_29;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *kernel_local;
  Data *d_local;
  Settings *s_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *img;
  
  s->nxy = s->nx * s->ny;
  local_29 = 0;
  iVar1 = s->nxy;
  local_28 = kernel;
  kernel_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)d;
  d_local = (Data *)s;
  s_local = (Settings *)__return_storage_ptr__;
  std::allocator<unsigned_int>::allocator(&local_2a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(long)iVar1,&local_2a);
  std::allocator<unsigned_int>::~allocator(&local_2a);
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(__return_storage_ptr__);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(__return_storage_ptr__);
  pstr.field_2._12_4_ = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current,(int *)(pstr.field_2._M_local_buf + 0xc));
  pstr.field_2._8_4_ = 0x46;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"=",(allocator<char> *)((long)&scalar + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&scalar + 7));
  scaleMax = 1.0;
  local_90 = 1000000000.0;
  if (*(int *)&(d_local->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage == 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Convoluting pointwise...");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    uVar5 = pstr.field_2._8_4_;
    std::__cxx11::string::string((string *)local_b0,local_78);
    printBar(uVar5,(string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    for (local_b4 = 0;
        local_b4 <
        *(int *)&kernel_local[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start; local_b4 = local_b4 + 1) {
      iVar6 = pstr.field_2._8_4_ * local_b4;
      iVar1 = *(int *)&kernel_local[6].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&local_d8,local_78);
      printProgress(iVar6 / iVar1,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      s_00 = d_local;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(kernel_local + 1),
                          (long)local_b4);
      lat_00 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(kernel_local + 2),
                          (long)local_b4);
      addKernel((Settings *)s_00,lat_00,*pvVar8,__return_storage_ptr__,local_28,scaleMax);
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"Convoluting linearly...");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    uVar5 = pstr.field_2._8_4_;
    std::__cxx11::string::string((string *)local_f8,local_78);
    printBar(uVar5,(string *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    dd._4_4_ = 0;
    dd0 = 0.0;
    dStack_110 = 0.0;
    dpix._4_4_ = 0;
    while ((int)dpix._4_4_ <
           *(int *)&kernel_local[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
      iVar6 = pstr.field_2._8_4_ * dpix._4_4_;
      iVar1 = *(int *)&kernel_local[6].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&x0,local_78);
      printProgress(iVar6 / iVar1,(string *)&x0);
      std::__cxx11::string::~string((string *)&x0);
      vVar3 = dpix._4_4_;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (kernel_local + 5,(ulong)dd._4_4_);
      if (vVar3 == *pvVar9) {
        dd._4_4_ = dd._4_4_ + 1;
        dpix._4_4_ = dpix._4_4_ + 1;
        dd0 = 0.0;
      }
      else {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(kernel_local + 2),
                            (long)(int)dpix._4_4_);
        y0 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(kernel_local + 1),
                            (long)(int)dpix._4_4_);
        x1 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(kernel_local + 2),
                            (long)(int)(dpix._4_4_ + 1));
        y1 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(kernel_local + 1),
                            (long)(int)(dpix._4_4_ + 1));
        s0 = *pvVar8;
        if (*(int *)&d_local[2].iEndSeg.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage != 2) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(kernel_local + 4),
                              (long)(int)dpix._4_4_);
          s1 = *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(kernel_local + 4),
                              (long)(int)(dpix._4_4_ + 1));
          lat = *pvVar8;
        }
        _Var11 = std::pow<double,int>(y1 - y0,2);
        _Var12 = std::pow<double,int>(s0 - x1,2);
        local_120 = sqrt(_Var11 + _Var12);
        local_120 = local_120 /
                    (double)(d_local->eles).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
        for (; dd0 < 1.0;
            dd0 = ((double)(d_local->iEndSeg).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start *
                  (double)*(int *)&(d_local->eles).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage) / local_120 + dd0) {
          lon = dd0 * (s0 - x1) + x1;
          sca = dd0 * (y1 - y0) + y0;
          if (*(int *)&d_local[2].iEndSeg.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage != 2) {
            dpix0 = dd0 * (lat - s1) + s1;
            scaleMax = (local_90 *
                       (dpix0 - (double)(d_local->lons).
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish)) /
                       ((double)(d_local->lons).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (double)(d_local->lons).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
          }
          addKernel((Settings *)d_local,lon,sca,__return_storage_ptr__,local_28,scaleMax);
          dStack_110 = dd0;
          if ((local_120 == 0.0) && (!NAN(local_120))) {
            dpix._4_4_ = dpix._4_4_ + 1;
            break;
          }
        }
      }
      x0_1 = local_120;
      if ((local_120 != 0.0) || (NAN(local_120))) {
        while( true ) {
          uVar4 = dpix._4_4_;
          bVar2 = false;
          if (1.0 <= dd0) {
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (kernel_local + 5,(ulong)dd._4_4_);
            bVar2 = false;
            if (uVar4 < *pvVar9) {
              bVar2 = (int)dpix._4_4_ <
                      *(int *)&kernel_local[6].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
            }
          }
          if (!bVar2) break;
          dpix._4_4_ = dpix._4_4_ + 1;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(kernel_local + 2),
                              (long)(int)dpix._4_4_);
          y0_1 = *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(kernel_local + 1),
                              (long)(int)dpix._4_4_);
          x1_1 = *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(kernel_local + 2),
                              (long)(int)(dpix._4_4_ + 1));
          y1_1 = *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(kernel_local + 1),
                              (long)(int)(dpix._4_4_ + 1));
          ddres = *pvVar8;
          if ((((y0_1 != y1_1) || (NAN(y0_1) || NAN(y1_1))) || (x1_1 != ddres)) ||
             (NAN(x1_1) || NAN(ddres))) {
            x0_1 = local_120;
            _Var11 = std::pow<double,int>(y1_1 - y0_1,2);
            _Var12 = std::pow<double,int>(ddres - x1_1,2);
            local_120 = sqrt(_Var11 + _Var12);
            local_120 = local_120 /
                        (double)(d_local->eles).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
            pixres = 1.0 - dStack_110;
            pixstart = pixres * x0_1;
            local_1c8 = (double)(d_local->iEndSeg).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start *
                        (double)*(int *)&(d_local->eles).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage + -pixstart;
            dd0 = local_1c8 / local_120;
            dStack_110 = dd0 - ((double)(d_local->iEndSeg).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start *
                               (double)*(int *)&(d_local->eles).
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage) /
                               local_120;
          }
        }
      }
      local_1d0 = 0.0;
      pdVar10 = std::max<double>(&dd0,&local_1d0);
      dd0 = *pdVar10;
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"|");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  local_29 = 1;
  std::__cxx11::string::~string(local_78);
  if ((local_29 & 1) == 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> convolute(Settings& s, Data& d,
		std::vector<unsigned int>& kernel)
{
	s.nxy = s.nx * s.ny;
	std::vector<unsigned int> img(s.nxy);

	// Initialize
	std::fill(img.begin(), img.end(), 0);

	// Number of characters in progress bar
	int np = 70;
	const std::string pstr = "=";

	// Kernel scalar for map types other than heat
	double scalar = 1.0;
	double scaleMax = 1.e9;

	if (s.sampling == pointwise)
	{
		std::cout << "Convoluting pointwise..." << std::endl;
		printBar(np, pstr);
		for (int i = 0; i < d.ntrkptsum; i++)
		{
			printProgress(np * i / d.ntrkptsum, pstr);
			addKernel(s, d.lats[i], d.lons[i], img, kernel, scalar);
		}
	}
	else
	{
		std::cout << "Convoluting linearly..." << std::endl;
		printBar(np, pstr);
		unsigned int iseg = 0;
		double dd = 0.0;
		double dd0 = 0.0;

		int i = 0;
		while (i < d.ntrkptsum)
		{
			double dpix;
			printProgress(np * i / d.ntrkptsum, pstr);
			if (i == d.iEndSeg[iseg])
			{
				// Final point
				iseg++;
				i++;
				dd = 0.0;
			}
			else
			{
				//std::cout << "sampling dd = " << dd << std::endl;

				// Linear subsampling

				double x0 = d.lons[i];
				double y0 = d.lats[i];
				double x1 = d.lons[i + 1];
				double y1 = d.lats[i + 1];

				double s0, s1;
				if (s.mapType != heat)
				{
					s0 = d.scas[i];
					s1 = d.scas[i + 1];
				}

				// Distance between trackpoint i and i+1 in units of
				// pixels.  Already calculated?
				dpix = sqrt(pow(x1 - x0, 2) + pow(y1 - y0, 2)) / s.degPerPix;

				while (dd < 1.0)
				{
					//std::cout << "dd = " << dd << std::endl;

					double lat = y0 + dd * (y1 - y0);
					double lon = x0 + dd * (x1 - x0);

					if (s.mapType != heat)
					{
						double sca = s0 + dd * (s1 - s0);
						scalar = scaleMax * (sca - s.mins) / (s.maxs - s.mins);
						//std::cout << "scalar = " << scalar << "\n";
					}

					addKernel(s, lat, lon, img, kernel, scalar);

					dd0 = dd;
					if (dpix == 0.0)
					{
						i++;
						break;
					}
					else
					{
						// Move a step of a fraction of the kernel radius
						dd += s.step * s.r / dpix;
					}

				}
			}
			//std::cout << "d.iEndSeg[iseg] = " << d.iEndSeg[iseg] << "\n";

			// Offset next kernel one step size away from last one
			double dpix0 = dpix;
			if (dpix0 != 0.0)
			{
				while (dd >= 1.0 && i < d.iEndSeg[iseg] && i < d.ntrkptsum)
				{
					i++;
					//std::cout << "i = " << i << std::endl;

					double x0 = d.lons[i];
					double y0 = d.lats[i];
					double x1 = d.lons[i + 1];
					double y1 = d.lats[i + 1];

					if (x0 != x1 || y0 != y1)
					{
						dpix0 = dpix;
						dpix = sqrt(pow(x1 - x0, 2) + pow(y1 - y0, 2)) / s.degPerPix;

						// Residual distance leftover from the last
						// line, as a fraction of last line's length
						double ddres = 1.0 - dd0;

						// Residual in pixels
						double pixres = ddres * dpix0;

						// Offset from new starting point in pixels
						double pixstart = s.step * s.r - pixres;

						// Dimensionless offset (and hypothetical
						// previous point in case of overflow)
						dd = pixstart / dpix;
						dd0 = dd - s.step * s.r / dpix;

						//std::cout << "dd = " << dd << std::endl;
					}
				}
			}

			// Just in case
			dd = std::max(dd, 0.0);

		}
	}
	std::cout << "|" << std::endl;

	//std::cout << img << std::endl;
	return img;
}